

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

void fiber_exec_on(Fiber *active,Fiber *temp,FiberFunc f,void *args)

{
  _Bool _Var1;
  void *args_local;
  FiberFunc f_local;
  Fiber *temp_local;
  Fiber *active_local;
  
  _Var1 = fiber_is_executing(active);
  if (!_Var1) {
    __assert_fail("fiber_is_executing(active)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c",
                  0x164,"void fiber_exec_on(Fiber *, Fiber *, FiberFunc, void *)");
  }
  if (active == temp) {
    (*f)(args);
  }
  else {
    _Var1 = fiber_is_executing(temp);
    if (_Var1) {
      __assert_fail("!fiber_is_executing(temp)",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c"
                    ,0x169,"void fiber_exec_on(Fiber *, Fiber *, FiberFunc, void *)");
    }
    temp->state = temp->state | 1;
    active->state = active->state & 0xfffe;
    fiber_asm_exec_on_stack(args,f,(temp->regs).sp);
    active->state = active->state | 1;
    temp->state = temp->state & 0xfffe;
  }
  return;
}

Assistant:

void
fiber_exec_on(Fiber *active, Fiber *temp, FiberFunc f, void *args)
{
    NULL_CHECK(active, "Fiber cannot be NULL");
    NULL_CHECK(temp, "Fiber cannot be NULL");
    assert(fiber_is_executing(active));

    if (active == temp) {
        f(args);
    } else {
        assert(!fiber_is_executing(temp));
        temp->state |= FIBER_FS_EXECUTING;
        active->state &= ~FIBER_FS_EXECUTING;
        fiber_asm_exec_on_stack(args, f, temp->regs.sp);
        active->state |= FIBER_FS_EXECUTING;
        temp->state &= ~FIBER_FS_EXECUTING;
    }
}